

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

TestCaseGroup * vkt::SpirVAssembly::createOpSourceTests(TestContext *testCtx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  long *plVar4;
  mapped_type *pmVar5;
  ulong *puVar6;
  size_type *psVar7;
  size_t num4ByteChars;
  undefined8 uVar8;
  long lVar9;
  NameCodePair *name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  key_type local_368;
  vector<int,_std::allocator<int>_> local_348;
  undefined8 uStack_330;
  TestCaseGroup *local_320;
  string opsourceGLSLWithFile;
  __string_type __str;
  string local_2d8;
  RGBA defaultColors [4];
  NameCodePair tests [9];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  
  defaultColors[0].m_value = 0;
  defaultColors[1].m_value = 0;
  defaultColors[2].m_value = 0;
  defaultColors[3].m_value = 0;
  local_320 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(local_320,testCtx,"opsource","OpSource instruction");
  opsourceGLSLWithFile._M_dataplus._M_p = (pointer)&opsourceGLSLWithFile.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&opsourceGLSLWithFile,
             "%opsrcfile = OpString \"foo.vert\"\nOpSource GLSL 450 %opsrcfile ","");
  passthruFragments_abi_cxx11_();
  tests[0].name._M_dataplus._M_p = (pointer)&tests[0].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)tests,"unknown","");
  tests[0].code._M_dataplus._M_p = (pointer)&tests[0].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[0].code,"OpSource Unknown 321","");
  tests[1].name._M_dataplus._M_p = (pointer)&tests[1].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 1),"essl","");
  tests[1].code._M_dataplus._M_p = (pointer)&tests[1].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tests[1].code,"OpSource ESSL 310","");
  tests[2].name._M_dataplus._M_p = (pointer)&tests[2].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 2),"glsl","");
  tests[2].code._M_dataplus._M_p = (pointer)&tests[2].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tests[2].code,"OpSource GLSL 450","");
  tests[3].name._M_dataplus._M_p = (pointer)&tests[3].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 3),"opencl_cpp","");
  tests[3].code._M_dataplus._M_p = (pointer)&tests[3].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[3].code,"OpSource OpenCL_CPP 120","");
  tests[4].name._M_dataplus._M_p = (pointer)&tests[4].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 4),"opencl_c","");
  tests[4].code._M_dataplus._M_p = (pointer)&tests[4].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[4].code,"OpSource OpenCL_C 120","");
  tests[5].name._M_dataplus._M_p = (pointer)&tests[5].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 5),"multiple","");
  tests[5].code._M_dataplus._M_p = (pointer)&tests[5].code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tests[5].code,"OpSource GLSL 450\nOpSource GLSL 450","");
  tests[6].name._M_dataplus._M_p = (pointer)&tests[6].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 6),"file","");
  tests[6].code._M_dataplus._M_p = (pointer)&tests[6].code.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&tests[6].code,opsourceGLSLWithFile._M_dataplus._M_p,
             opsourceGLSLWithFile._M_dataplus._M_p + opsourceGLSLWithFile._M_string_length);
  tests[7].name._M_dataplus._M_p = (pointer)&tests[7].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 7),"source","");
  tests[7].code._M_dataplus._M_p = (pointer)&tests[7].code.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&tests[7].code,opsourceGLSLWithFile._M_dataplus._M_p,
             opsourceGLSLWithFile._M_dataplus._M_p + opsourceGLSLWithFile._M_string_length);
  std::__cxx11::string::append((char *)&tests[7].code);
  tests[8].name._M_dataplus._M_p = (pointer)&tests[8].name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(tests + 8),"longsource","");
  paVar2 = &__str.field_2;
  __str._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__str,opsourceGLSLWithFile._M_dataplus._M_p,
             opsourceGLSLWithFile._M_dataplus._M_p + opsourceGLSLWithFile._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&__str,__str._M_string_length,0,'\x01');
  (anonymous_namespace)::makeLongUTF8String_abi_cxx11_
            (&local_2d8,(_anonymous_namespace_ *)0xfffa,num4ByteChars);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar2) {
    uVar8 = __str.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_2d8._M_string_length + __str._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      uVar8 = local_2d8.field_2._M_allocated_capacity;
    }
    if (local_2d8._M_string_length + __str._M_string_length <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_2d8,0,(char *)0x0,(ulong)__str._M_dataplus._M_p);
      goto LAB_00532085;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&__str,(ulong)local_2d8._M_dataplus._M_p);
LAB_00532085:
  local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  plVar4 = puVar3 + 2;
  if ((pointer *)*puVar3 == (pointer *)plVar4) {
    local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar4;
    uStack_330 = puVar3[3];
  }
  else {
    local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar4;
    local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)*puVar3;
  }
  local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_348);
  paVar1 = &local_368.field_2;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar6) {
    local_368.field_2._M_allocated_capacity = *puVar6;
    local_368.field_2._8_8_ = plVar4[3];
    local_368._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_368.field_2._M_allocated_capacity = *puVar6;
    local_368._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_368._M_string_length = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_368,local_368._M_string_length,0,'\x01');
  paVar10 = &tests[8].code.field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar7) {
    tests[8].code.field_2._0_8_ = *psVar7;
    tests[8].code.field_2._8_8_ = plVar4[3];
    tests[8].code._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    tests[8].code.field_2._0_8_ = *psVar7;
    tests[8].code._M_dataplus._M_p = (pointer)*plVar4;
  }
  tests[8].code._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((pointer *)
      local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  getDefaultColors(&defaultColors);
  lVar9 = 9;
  name = tests;
  do {
    local_368._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"debug","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&fragments,&local_368);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar1) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    local_368._M_string_length = 0;
    local_368.field_2._M_allocated_capacity =
         local_368.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_368._M_dataplus._M_p = (pointer)paVar1;
    createTestsForAllStages
              (&name->name,&defaultColors,&defaultColors,&fragments,&local_348,local_320,
               QP_TEST_RESULT_FAIL,&local_368);
    if ((pointer *)
        local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer *)0x0) {
      operator_delete(local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_348.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar1) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    name = name + 1;
    lVar9 = lVar9 + -1;
  } while (lVar9 != 0);
  lVar9 = -0x240;
  do {
    plVar4 = (long *)(((string *)(paVar10 + -1))->_M_dataplus)._M_p;
    if (paVar10 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar4) {
      operator_delete(plVar4,paVar10->_M_allocated_capacity + 1);
    }
    if (paVar10 + -2 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)paVar10[-3]._M_allocated_capacity) {
      operator_delete((long *)paVar10[-3]._M_allocated_capacity,
                      paVar10[-2]._M_allocated_capacity + 1);
    }
    paVar10 = paVar10 + -4;
    lVar9 = lVar9 + 0x40;
  } while (lVar9 != 0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&fragments._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)opsourceGLSLWithFile._M_dataplus._M_p != &opsourceGLSLWithFile.field_2) {
    operator_delete(opsourceGLSLWithFile._M_dataplus._M_p,
                    opsourceGLSLWithFile.field_2._M_allocated_capacity + 1);
  }
  return local_320;
}

Assistant:

tcu::TestCaseGroup* createOpSourceTests (tcu::TestContext& testCtx)
{
	struct NameCodePair { string name, code; };
	RGBA							defaultColors[4];
	de::MovePtr<tcu::TestCaseGroup> opSourceTests			(new tcu::TestCaseGroup(testCtx, "opsource", "OpSource instruction"));
	const std::string				opsourceGLSLWithFile	= "%opsrcfile = OpString \"foo.vert\"\nOpSource GLSL 450 %opsrcfile ";
	map<string, string>				fragments				= passthruFragments();
	const NameCodePair				tests[]					=
	{
		{"unknown", "OpSource Unknown 321"},
		{"essl", "OpSource ESSL 310"},
		{"glsl", "OpSource GLSL 450"},
		{"opencl_cpp", "OpSource OpenCL_CPP 120"},
		{"opencl_c", "OpSource OpenCL_C 120"},
		{"multiple", "OpSource GLSL 450\nOpSource GLSL 450"},
		{"file", opsourceGLSLWithFile},
		{"source", opsourceGLSLWithFile + "\"void main(){}\""},
		// Longest possible source string: SPIR-V limits instructions to 65535
		// words, of which the first 4 are opsourceGLSLWithFile; the rest will
		// contain 65530 UTF8 characters (one word each) plus one last word
		// containing 3 ASCII characters and \0.
		{"longsource", opsourceGLSLWithFile + '"' + makeLongUTF8String(65530) + "ccc" + '"'}
	};

	getDefaultColors(defaultColors);
	for (size_t testNdx = 0; testNdx < sizeof(tests) / sizeof(NameCodePair); ++testNdx)
	{
		fragments["debug"] = tests[testNdx].code;
		createTestsForAllStages(tests[testNdx].name, defaultColors, defaultColors, fragments, opSourceTests.get());
	}

	return opSourceTests.release();
}